

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall flatbuffers::Parser::SkipAnyJsonValue(Parser *this)

{
  undefined1 *puVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  int t;
  long in_RSI;
  long lVar5;
  CheckedError *ce;
  bool bVar6;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  iVar4 = *(int *)(in_RSI + 0x77c);
  if (0x40 < iVar4) {
    __assert_fail("caller_depth_ <= (FLATBUFFERS_MAX_PARSING_DEPTH) && \"Check() must be called to prevent stack overflow\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                  ,0x19d,"flatbuffers::Parser::ParseDepthGuard::ParseDepthGuard(Parser *)");
  }
  *(int *)(in_RSI + 0x77c) = iVar4 + 1;
  if (iVar4 == 0x40) {
    RecurseError(this);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (((ulong)(this->super_ParserState).prev_cursor_ & 1) != 0) goto LAB_0010d051;
  }
  else {
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
  }
  puVar1 = (undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1);
  iVar4 = *(int *)(in_RSI + 0x1c);
  if (iVar4 < 0x101) {
    t = (int)in_RSI;
    if (iVar4 == 0x5b) {
      Expect(this,t);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
        lVar5 = 0;
        do {
          bVar6 = lVar5 == 0;
          lVar5 = lVar5 + -1;
          if ((bVar6 || (~*(byte *)(in_RSI + 0x3ea) & 1) != 0) && (*(int *)(in_RSI + 0x1c) == 0x5d))
          {
LAB_0010d0ef:
            Next(this);
            goto LAB_0010cdfc;
          }
          SkipAnyJsonValue(this);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') break;
          if (*(int *)(in_RSI + 0x1c) == 0x5d) goto LAB_0010d0ef;
          if (*(char *)(in_RSI + 0x548) == '\0') {
            Expect(this,t);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            cVar3 = *(char *)&(this->super_ParserState).prev_cursor_;
            if (cVar3 == '\0') goto LAB_0010d0d9;
          }
          else {
LAB_0010d0d9:
            *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
            cVar3 = '\0';
          }
          *puVar1 = 1;
        } while (cVar3 == '\0');
      }
      goto LAB_0010d051;
    }
    if (iVar4 != 0x7b) goto LAB_0010d029;
    Expect(this,t);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010d051;
    lVar5 = 0;
    do {
      if (((byte)(lVar5 == 0 | *(byte *)(in_RSI + 0x3ea) ^ 1) == 1) &&
         (*(int *)(in_RSI + 0x1c) == 0x7d)) goto LAB_0010cfa3;
      local_50 = &local_40;
      local_48 = 0;
      local_40 = 0;
      std::__cxx11::string::_M_assign((string *)&local_50);
      if (*(int *)(in_RSI + 0x1c) == 0x101) {
        Next(this);
      }
      else {
        Expect(this,t);
      }
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      cVar3 = '\x01';
      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
        if ((*(char *)(in_RSI + 0x548) != '\x01') || ((*(uint *)(in_RSI + 0x1c) | 0x20) != 0x7b)) {
          Expect(this,t);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          cVar3 = '\x01';
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010cf76;
        }
        SkipAnyJsonValue(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        bVar6 = *(char *)&(this->super_ParserState).prev_cursor_ == '\0';
        if (bVar6) {
          lVar5 = lVar5 + 1;
          *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
        }
        else {
          cVar3 = '\x01';
          if (!bVar6) goto LAB_0010cf76;
        }
        cVar3 = '\x02';
        if (*(int *)(in_RSI + 0x1c) != 0x7d) {
          if (*(char *)(in_RSI + 0x548) == '\0') {
            Expect(this,t);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            cVar3 = *(char *)&(this->super_ParserState).prev_cursor_;
            if (cVar3 == '\0') goto LAB_0010cf66;
          }
          else {
LAB_0010cf66:
            *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
            cVar3 = '\0';
          }
          *puVar1 = 1;
        }
      }
LAB_0010cf76:
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
    } while (cVar3 == '\0');
    if (cVar3 != '\x02') goto LAB_0010d051;
LAB_0010cfa3:
    Next(this);
  }
  else {
    if (2 < iVar4 - 0x101U) {
      if (iVar4 == 0x104) {
        pcVar2 = (char *)(in_RSI + 0x28);
        iVar4 = std::__cxx11::string::compare(pcVar2);
        if ((iVar4 == 0) ||
           ((*(int *)(in_RSI + 0x1c) == 0x104 &&
            ((iVar4 = std::__cxx11::string::compare(pcVar2), iVar4 == 0 ||
             ((*(int *)(in_RSI + 0x1c) == 0x104 &&
              ((iVar4 = std::__cxx11::string::compare(pcVar2), iVar4 == 0 ||
               ((*(int *)(in_RSI + 0x1c) == 0x104 &&
                (iVar4 = std::__cxx11::string::compare(pcVar2), iVar4 == 0)))))))))))) {
          Next(this);
          goto LAB_0010cdfc;
        }
      }
LAB_0010d029:
      TokenError(this);
      goto LAB_0010d051;
    }
    Next(this);
  }
LAB_0010cdfc:
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
  }
LAB_0010d051:
  *(int *)(in_RSI + 0x77c) = *(int *)(in_RSI + 0x77c) + -1;
  return SUB82(this,0);
}

Assistant:

explicit ParseDepthGuard(Parser *parser_not_null)
      : parser_(*parser_not_null), caller_depth_(parser_.parse_depth_counter_) {
    FLATBUFFERS_ASSERT(caller_depth_ <= (FLATBUFFERS_MAX_PARSING_DEPTH) &&
                       "Check() must be called to prevent stack overflow");
    parser_.parse_depth_counter_ += 1;
  }